

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_4bytes.cpp
# Opt level: O1

Sketch * ConstructClMulTri4Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMulTri4Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_25
    case 25: return new SketchImpl<FieldTri25>(implementation, 25);
#endif
#ifdef ENABLE_FIELD_INT_28
    case 28: return new SketchImpl<FieldTri28>(implementation, 28);
#endif
#ifdef ENABLE_FIELD_INT_29
    case 29: return new SketchImpl<FieldTri29>(implementation, 29);
#endif
#ifdef ENABLE_FIELD_INT_30
    case 30: return new SketchImpl<FieldTri30>(implementation, 30);
#endif
#ifdef ENABLE_FIELD_INT_31
    case 31: return new SketchImpl<FieldTri31>(implementation, 31);
#endif
    }
    return nullptr;
}